

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_join.cpp
# Opt level: O1

idx_t __thiscall
duckdb::PositionalJoinGlobalState::CopyData
          (PositionalJoinGlobalState *this,DataChunk *output,idx_t count,idx_t col_offset)

{
  idx_t iVar1;
  ulong uVar2;
  reference pvVar3;
  reference pvVar4;
  ulong uVar5;
  idx_t target_offset;
  size_type sVar6;
  
  if ((this->source_offset == 0) && ((count <= (this->source).count || (this->exhausted == true))))
  {
    if ((this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar6 = 0;
      do {
        pvVar3 = vector<duckdb::Vector,_true>::operator[](&output->data,col_offset + sVar6);
        pvVar4 = vector<duckdb::Vector,_true>::operator[](&(this->source).data,sVar6);
        Vector::Reference(pvVar3,pvVar4);
        sVar6 = sVar6 + 1;
      } while (sVar6 < (ulong)(((long)(this->source).data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->source).data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x4ec4ec4ec4ec4ec5));
    }
    this->source_offset = this->source_offset + count;
  }
  else if (count != 0) {
    target_offset = 0;
    do {
      uVar2 = count - target_offset;
      iVar1 = this->source_offset;
      uVar5 = (this->source).count - iVar1;
      if (this->exhausted != false) {
        uVar5 = uVar2;
      }
      if (uVar2 < uVar5) {
        uVar5 = uVar2;
      }
      if ((this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        sVar6 = 0;
        do {
          pvVar3 = vector<duckdb::Vector,_true>::operator[](&(this->source).data,sVar6);
          pvVar4 = vector<duckdb::Vector,_true>::operator[](&output->data,col_offset + sVar6);
          VectorOperations::Copy(pvVar3,pvVar4,iVar1 + uVar5,this->source_offset,target_offset);
          sVar6 = sVar6 + 1;
        } while (sVar6 < (ulong)(((long)(this->source).data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->source).data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x4ec4ec4ec4ec4ec5));
      }
      target_offset = target_offset + uVar5;
      this->source_offset = this->source_offset + uVar5;
      Refill(this);
    } while (target_offset < count);
  }
  return ((long)(this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
}

Assistant:

idx_t PositionalJoinGlobalState::CopyData(DataChunk &output, const idx_t count, const idx_t col_offset) {
	if (!source_offset && (source.size() >= count || exhausted)) {
		//	Fast track: aligned and has enough data
		for (idx_t i = 0; i < source.ColumnCount(); ++i) {
			output.data[col_offset + i].Reference(source.data[i]);
		}
		source_offset += count;
	} else {
		// Copy data
		for (idx_t target_offset = 0; target_offset < count;) {
			const auto needed = count - target_offset;
			const auto available = exhausted ? needed : (source.size() - source_offset);
			const auto copy_size = MinValue(needed, available);
			const auto source_count = source_offset + copy_size;
			for (idx_t i = 0; i < source.ColumnCount(); ++i) {
				VectorOperations::Copy(source.data[i], output.data[col_offset + i], source_count, source_offset,
				                       target_offset);
			}
			target_offset += copy_size;
			source_offset += copy_size;
			Refill();
		}
	}

	return source.ColumnCount();
}